

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustach.c
# Opt level: O0

int process(char *template,mustach_itf *itf,void *closure,FILE *file,char *opstr,char *clstr)

{
  long lVar1;
  void *pvVar2;
  code *pcVar3;
  long lVar4;
  mustach_itf *pmVar5;
  size_t sVar6;
  char *file_00;
  FILE *pFVar7;
  char *template_00;
  size_t sVar8;
  char *pcVar9;
  ushort **ppuVar10;
  int *__dest;
  int iVar11;
  char *pcVar12;
  long in_FS_OFFSET;
  bool bVar13;
  int local_24c8;
  int local_24c4;
  bool local_24be;
  byte local_24bd;
  int local_24bc;
  bool local_24b6;
  bool local_24b5;
  int local_24b4;
  mustach_itf *local_24b0;
  int local_24a4;
  int local_24a0;
  int emit;
  int rc;
  int depth;
  size_t l;
  size_t len;
  size_t cllen;
  size_t oplen;
  char *term;
  char *beg;
  char *tmp;
  char *pcStack_2458;
  char c;
  char *clstr_local;
  char *opstr_local;
  FILE *file_local;
  void *closure_local;
  mustach_itf *itf_local;
  char *template_local;
  char *local_2420;
  char *partial;
  anon_struct_32_5_7b674a85 stack [256];
  char name [1025];
  
  __dest = &local_24c8;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_24a4 = 1;
  pcStack_2458 = clstr;
  clstr_local = opstr;
  opstr_local = (char *)file;
  file_local = (FILE *)closure;
  closure_local = itf;
  itf_local = (mustach_itf *)template;
  cllen = strlen(opstr);
  len = strlen(pcStack_2458);
  emit = 0;
LAB_00105a3c:
  do {
    pmVar5 = itf_local;
    pcVar12 = clstr_local;
    builtin_strncpy((char *)((long)__dest + -8),"OZ\x10",4);
    *(char *)((long)__dest + -4) = '\0';
    *(char *)((long)__dest + -3) = '\0';
    *(char *)((long)__dest + -2) = '\0';
    *(char *)((long)__dest + -1) = '\0';
    term = strstr((char *)pmVar5,pcVar12);
    pmVar5 = itf_local;
    pcVar12 = opstr_local;
    if (term == (char *)0x0) {
      if (local_24a4 != 0) {
        local_24b0 = itf_local;
        *(char *)((long)__dest + -8) = -0x7d;
        *(char *)((long)__dest + -7) = 'Z';
        *(char *)((long)__dest + -6) = '\x10';
        *(char *)((long)__dest + -5) = '\0';
        *(char *)((long)__dest + -4) = '\0';
        *(char *)((long)__dest + -3) = '\0';
        *(char *)((long)__dest + -2) = '\0';
        *(char *)((long)__dest + -1) = '\0';
        sVar8 = strlen((char *)pmVar5);
        pcVar12 = opstr_local;
        pmVar5 = local_24b0;
        *(char *)((long)__dest + -8) = -0x62;
        *(char *)((long)__dest + -7) = 'Z';
        *(char *)((long)__dest + -6) = '\x10';
        *(char *)((long)__dest + -5) = '\0';
        *(char *)((long)__dest + -4) = '\0';
        *(char *)((long)__dest + -3) = '\0';
        *(char *)((long)__dest + -2) = '\0';
        *(char *)((long)__dest + -1) = '\0';
        fwrite(pmVar5,sVar8,1,(FILE *)pcVar12);
      }
      template_local._4_4_ = 0;
      if (emit != 0) {
        template_local._4_4_ = -2;
      }
      goto LAB_001064df;
    }
    if (local_24a4 != 0) {
      sVar8 = (long)term - (long)itf_local;
      *(char *)((long)__dest + -8) = -0x12;
      *(char *)((long)__dest + -7) = 'Z';
      *(char *)((long)__dest + -6) = '\x10';
      *(char *)((long)__dest + -5) = '\0';
      *(char *)((long)__dest + -4) = '\0';
      *(char *)((long)__dest + -3) = '\0';
      *(char *)((long)__dest + -2) = '\0';
      *(char *)((long)__dest + -1) = '\0';
      fwrite(pmVar5,sVar8,1,(FILE *)pcVar12);
    }
    pcVar12 = pcStack_2458;
    pcVar9 = term + cllen;
    term = pcVar9;
    builtin_strncpy((char *)((long)__dest + -8),"\x16[\x10",4);
    *(char *)((long)__dest + -4) = '\0';
    *(char *)((long)__dest + -3) = '\0';
    *(char *)((long)__dest + -2) = '\0';
    *(char *)((long)__dest + -1) = '\0';
    oplen = (size_t)strstr(pcVar9,pcVar12);
    if ((char *)oplen == (char *)0x0) {
      template_local._4_4_ = -2;
      goto LAB_001064df;
    }
    itf_local = (mustach_itf *)(oplen + len);
    l = oplen - (long)term;
    tmp._7_1_ = *term;
    local_24b4 = (int)tmp._7_1_;
    if (local_24b4 != 0x21) {
      if (((local_24b4 == 0x23) || (local_24b4 == 0x26)) || (local_24b4 == 0x2f)) goto LAB_00105cd3;
      if (local_24b4 == 0x3d) goto LAB_00105e2f;
      if ((local_24b4 == 0x3e) || (local_24b4 == 0x5e)) {
LAB_00105cd3:
        term = term + 1;
        l = l - 1;
      }
      else if (local_24b4 == 0x7b) {
        for (_rc = 0; pcStack_2458[_rc] == '}'; _rc = _rc + 1) {
        }
        if (pcStack_2458[_rc] == '\0') {
          if (*(char *)(oplen + _rc) != '}') {
            template_local._4_4_ = -8;
            goto LAB_001064df;
          }
          itf_local = (mustach_itf *)((long)&itf_local->start + 1);
        }
        else {
          if ((l == 0) || (term[l - 1] != '}')) {
            template_local._4_4_ = -8;
            goto LAB_001064df;
          }
          l = l - 1;
        }
        tmp._7_1_ = '&';
        goto LAB_00105cd3;
      }
      while( true ) {
        local_24b5 = false;
        if (l != 0) {
          builtin_strncpy((char *)((long)__dest + -8),"\x10]\x10",4);
          *(char *)((long)__dest + -4) = '\0';
          *(char *)((long)__dest + -3) = '\0';
          *(char *)((long)__dest + -2) = '\0';
          *(char *)((long)__dest + -1) = '\0';
          ppuVar10 = __ctype_b_loc();
          local_24b5 = ((*ppuVar10)[(int)*term] & 0x2000) != 0;
        }
        if (local_24b5 == false) break;
        term = term + 1;
        l = l - 1;
      }
      while( true ) {
        local_24b6 = false;
        if (l != 0) {
          *(char *)((long)__dest + -8) = -0x80;
          *(char *)((long)__dest + -7) = ']';
          *(char *)((long)__dest + -6) = '\x10';
          *(char *)((long)__dest + -5) = '\0';
          *(char *)((long)__dest + -4) = '\0';
          *(char *)((long)__dest + -3) = '\0';
          *(char *)((long)__dest + -2) = '\0';
          *(char *)((long)__dest + -1) = '\0';
          ppuVar10 = __ctype_b_loc();
          local_24b6 = ((*ppuVar10)[(int)term[l - 1]] & 0x2000) != 0;
        }
        pcVar12 = term;
        sVar6 = l;
        if (local_24b6 == false) break;
        l = l - 1;
      }
      if (l == 0) {
        template_local._4_4_ = -3;
        goto LAB_001064df;
      }
      if (0x400 < l) {
        template_local._4_4_ = -4;
        goto LAB_001064df;
      }
      builtin_strncpy((char *)((long)__dest + -8)," ^\x10",4);
      *(char *)((long)__dest + -4) = '\0';
      *(char *)((long)__dest + -3) = '\0';
      *(char *)((long)__dest + -2) = '\0';
      *(char *)((long)__dest + -1) = '\0';
      memcpy(&stack[0xff].emit,pcVar12,sVar6);
      *(undefined1 *)((long)&stack[0xff].emit + l) = 0;
    }
LAB_00105e2f:
    pvVar2 = closure_local;
    pFVar7 = file_local;
    pcVar12 = opstr_local;
    sVar6 = l;
    local_24bc = (int)tmp._7_1_;
  } while (local_24bc == 0x21);
  if (local_24bc == 0x23) {
LAB_001060f9:
    if (emit == 0x100) {
      template_local._4_4_ = -6;
      goto LAB_001064df;
    }
    local_24a0 = local_24a4;
    if (local_24a4 != 0) {
      pcVar3 = *(code **)((long)closure_local + 0x10);
      builtin_strncpy((char *)((long)__dest + -8),"Da\x10",4);
      *(char *)((long)__dest + -4) = '\0';
      *(char *)((long)__dest + -3) = '\0';
      *(char *)((long)__dest + -2) = '\0';
      *(char *)((long)__dest + -1) = '\0';
      local_24a0 = (*pcVar3)(pFVar7,&stack[0xff].emit);
      template_local._4_4_ = local_24a0;
      if (local_24a0 < 0) goto LAB_001064df;
    }
    if (*(char *)&itf_local->start == '\n') {
      itf_local = (mustach_itf *)((long)&itf_local->start + 1);
    }
    *(char **)&stack[(long)emit + -1].emit = term;
    stack[emit].name = (char *)itf_local;
    stack[emit].again = (char *)l;
    *(int *)&stack[emit].length = local_24a4;
    *(int *)((long)&stack[emit].length + 4) = local_24a0;
    if ((tmp._7_1_ == '#') == (local_24a0 == 0)) {
      local_24a4 = 0;
    }
    emit = emit + 1;
    goto LAB_00105a3c;
  }
  if (local_24bc != 0x2f) {
    if (local_24bc == 0x3d) {
      if ((l < 5) || (term[l - 1] != '=')) {
        template_local._4_4_ = -5;
        goto LAB_001064df;
      }
      term = term + 1;
      l = l - 2;
      _rc = 0;
      while( true ) {
        local_24bd = 0;
        if (_rc < l) {
          builtin_strncpy((char *)((long)__dest + -8),"\x1c_\x10",4);
          *(char *)((long)__dest + -4) = '\0';
          *(char *)((long)__dest + -3) = '\0';
          *(char *)((long)__dest + -2) = '\0';
          *(char *)((long)__dest + -1) = '\0';
          ppuVar10 = __ctype_b_loc();
          local_24bd = ((*ppuVar10)[(int)term[_rc]] & 0x2000) != 0 ^ 0xff;
        }
        pcVar12 = term;
        sVar8 = _rc;
        if ((local_24bd & 1) == 0) break;
        _rc = _rc + 1;
      }
      if (_rc == l) {
        template_local._4_4_ = -5;
        goto LAB_001064df;
      }
      cllen = _rc;
      lVar4 = -(_rc + 0x10 & 0xfffffffffffffff0);
      pcVar9 = (char *)((long)__dest + lVar4);
      beg = pcVar9;
      pcVar9[-8] = -0x2d;
      pcVar9[-7] = '_';
      pcVar9[-6] = '\x10';
      pcVar9[-5] = '\0';
      pcVar9[-4] = '\0';
      pcVar9[-3] = '\0';
      pcVar9[-2] = '\0';
      pcVar9[-1] = '\0';
      memcpy(pcVar9,pcVar12,sVar8);
      beg[cllen] = '\0';
      clstr_local = beg;
      while( true ) {
        local_24be = false;
        if (_rc < l) {
          builtin_strncpy((char *)((long)__dest + lVar4 + -8),"\x10`\x10",4);
          pcVar9[-4] = '\0';
          pcVar9[-3] = '\0';
          pcVar9[-2] = '\0';
          pcVar9[-1] = '\0';
          ppuVar10 = __ctype_b_loc();
          local_24be = ((*ppuVar10)[(int)term[_rc]] & 0x2000) != 0;
        }
        if (local_24be == false) break;
        _rc = _rc + 1;
      }
      if (_rc == l) {
        template_local._4_4_ = -5;
        __dest = (int *)pcVar9;
        goto LAB_001064df;
      }
      sVar8 = l - _rc;
      __dest = (int *)(pcVar9 + -(sVar8 + 0x10 & 0xfffffffffffffff0));
      pcVar12 = term + _rc;
      len = sVar8;
      beg = (char *)__dest;
      *(char *)((long)__dest + -8) = -0x2c;
      *(char *)((long)__dest + -7) = '`';
      *(char *)((long)__dest + -6) = '\x10';
      *(char *)((long)__dest + -5) = '\0';
      *(char *)((long)__dest + -4) = '\0';
      *(char *)((long)__dest + -3) = '\0';
      *(char *)((long)__dest + -2) = '\0';
      *(char *)((long)__dest + -1) = '\0';
      memcpy(__dest,pcVar12,sVar8);
      beg[len] = '\0';
      pcStack_2458 = beg;
    }
    else if (local_24bc == 0x3e) {
      if (local_24a4 != 0) {
        builtin_strncpy((char *)((long)__dest + -8),"\x10d\x10",4);
        *(char *)((long)__dest + -4) = '\0';
        *(char *)((long)__dest + -3) = '\0';
        *(char *)((long)__dest + -2) = '\0';
        *(char *)((long)__dest + -1) = '\0';
        local_24a0 = getpartial((mustach_itf *)pvVar2,pFVar7,(char *)&stack[0xff].emit,&local_2420);
        template_00 = local_2420;
        pvVar2 = closure_local;
        pFVar7 = file_local;
        file_00 = opstr_local;
        pcVar9 = clstr_local;
        pcVar12 = pcStack_2458;
        if (local_24a0 == 0) {
          builtin_strncpy((char *)((long)__dest + -8),"Nd\x10",4);
          *(char *)((long)__dest + -4) = '\0';
          *(char *)((long)__dest + -3) = '\0';
          *(char *)((long)__dest + -2) = '\0';
          *(char *)((long)__dest + -1) = '\0';
          local_24a0 = process(template_00,(mustach_itf *)pvVar2,pFVar7,(FILE *)file_00,pcVar9,
                               pcVar12);
          pcVar12 = local_2420;
          builtin_strncpy((char *)((long)__dest + -8),"`d\x10",4);
          *(char *)((long)__dest + -4) = '\0';
          *(char *)((long)__dest + -3) = '\0';
          *(char *)((long)__dest + -2) = '\0';
          *(char *)((long)__dest + -1) = '\0';
          free(pcVar12);
        }
        if (local_24a0 < 0) {
          template_local._4_4_ = local_24a0;
LAB_001064df:
          local_24c8 = template_local._4_4_;
          if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
            builtin_strncpy((char *)((long)__dest + -8),"\re\x10",4);
            *(char *)((long)__dest + -4) = '\0';
            *(char *)((long)__dest + -3) = '\0';
            *(char *)((long)__dest + -2) = '\0';
            *(char *)((long)__dest + -1) = '\0';
            __stack_chk_fail();
          }
          return template_local._4_4_;
        }
      }
    }
    else {
      if (local_24bc == 0x5e) goto LAB_001060f9;
      if (local_24a4 != 0) {
        pcVar3 = *(code **)((long)closure_local + 8);
        bVar13 = tmp._7_1_ != '&';
        *(char *)((long)__dest + -8) = -0x47;
        *(char *)((long)__dest + -7) = 'd';
        *(char *)((long)__dest + -6) = '\x10';
        *(char *)((long)__dest + -5) = '\0';
        *(char *)((long)__dest + -4) = '\0';
        *(char *)((long)__dest + -3) = '\0';
        *(char *)((long)__dest + -2) = '\0';
        *(char *)((long)__dest + -1) = '\0';
        local_24a0 = (*pcVar3)(pFVar7,&stack[0xff].emit,bVar13,pcVar12);
        template_local._4_4_ = local_24a0;
        if (local_24a0 < 0) goto LAB_001064df;
      }
    }
    goto LAB_00105a3c;
  }
  iVar11 = emit + -1;
  bVar13 = emit != 0;
  emit = iVar11;
  if ((bVar13) && ((char *)l == stack[iVar11].again)) {
    pvVar2 = *(void **)&stack[(long)iVar11 + -1].emit;
    *(char *)((long)__dest + -8) = -0x37;
    *(char *)((long)__dest + -7) = 'b';
    *(char *)((long)__dest + -6) = '\x10';
    *(char *)((long)__dest + -5) = '\0';
    *(char *)((long)__dest + -4) = '\0';
    *(char *)((long)__dest + -3) = '\0';
    *(char *)((long)__dest + -2) = '\0';
    *(char *)((long)__dest + -1) = '\0';
    iVar11 = memcmp(pvVar2,&stack[0xff].emit,sVar6);
    pFVar7 = file_local;
    if (iVar11 == 0) {
      if ((local_24a4 == 0) || (*(int *)((long)&stack[emit].length + 4) == 0)) {
        local_24c4 = 0;
      }
      else {
        pcVar3 = *(code **)((long)closure_local + 0x18);
        builtin_strncpy((char *)((long)__dest + -8),"\x15c\x10",4);
        *(char *)((long)__dest + -4) = '\0';
        *(char *)((long)__dest + -3) = '\0';
        *(char *)((long)__dest + -2) = '\0';
        *(char *)((long)__dest + -1) = '\0';
        local_24c4 = (*pcVar3)(pFVar7);
      }
      pFVar7 = file_local;
      local_24a0 = local_24c4;
      if (local_24c4 < 0) {
        template_local._4_4_ = local_24c4;
        goto LAB_001064df;
      }
      if (local_24c4 == 0) {
        local_24a4 = (int)stack[emit].length;
        if ((local_24a4 != 0) && (*(int *)((long)&stack[emit].length + 4) != 0)) {
          pcVar3 = *(code **)((long)closure_local + 0x20);
          *(char *)((long)__dest + -8) = -0x25;
          *(char *)((long)__dest + -7) = 'c';
          *(char *)((long)__dest + -6) = '\x10';
          *(char *)((long)__dest + -5) = '\0';
          *(char *)((long)__dest + -4) = '\0';
          *(char *)((long)__dest + -3) = '\0';
          *(char *)((long)__dest + -2) = '\0';
          *(char *)((long)__dest + -1) = '\0';
          (*pcVar3)(pFVar7);
        }
      }
      else {
        itf_local = (mustach_itf *)stack[emit].name;
        emit = emit + 1;
      }
      goto LAB_00105a3c;
    }
  }
  template_local._4_4_ = -7;
  goto LAB_001064df;
}

Assistant:

static int process(const char *template, struct mustach_itf *itf, void *closure, FILE *file, const char *opstr, const char *clstr)
{
	char name[NAME_LENGTH_MAX + 1], *partial, c, *tmp;
	const char *beg, *term;
	struct { const char *name, *again; size_t length; int emit, entered; } stack[DEPTH_MAX];
	size_t oplen, cllen, len, l;
	int depth, rc, emit;

	emit = 1;
	oplen = strlen(opstr);
	cllen = strlen(clstr);
	depth = 0;
	for(;;) {
		beg = strstr(template, opstr);
		if (beg == NULL) {
			/* no more mustach */
			if (emit)
				fwrite(template, strlen(template), 1, file);
			return depth ? MUSTACH_ERROR_UNEXPECTED_END : 0;
		}
		if (emit)
			fwrite(template, (size_t)(beg - template), 1, file);
		beg += oplen;
		term = strstr(beg, clstr);
		if (term == NULL)
			return MUSTACH_ERROR_UNEXPECTED_END;
		template = term + cllen;
		len = (size_t)(term - beg);
		c = *beg;
		switch(c) {
		case '!':
		case '=':
			break;
		case '{':
			for (l = 0 ; clstr[l] == '}' ; l++);
			if (clstr[l]) {
				if (!len || beg[len-1] != '}')
					return MUSTACH_ERROR_BAD_UNESCAPE_TAG;
				len--;
			} else {
				if (term[l] != '}')
					return MUSTACH_ERROR_BAD_UNESCAPE_TAG;
				template++;
			}
			c = '&';
			/*@fallthrough@*/
		case '^':
		case '#':
		case '/':
		case '&':
		case '>':
#if !defined(NO_EXTENSION_FOR_MUSTACH) && !defined(NO_COLON_EXTENSION_FOR_MUSTACH)
		case ':':
#endif
			beg++; len--;
		default:
			while (len && isspace(beg[0])) { beg++; len--; }
			while (len && isspace(beg[len-1])) len--;
#if defined(NO_EXTENSION_FOR_MUSTACH) || defined(NO_ALLOW_EMPTY_TAG)
			if (len == 0)
				return MUSTACH_ERROR_EMPTY_TAG;
#endif
			if (len > NAME_LENGTH_MAX)
				return MUSTACH_ERROR_TAG_TOO_LONG;
			memcpy(name, beg, len);
			name[len] = 0;
			break;
		}
		switch(c) {
		case '!':
			/* comment */
			/* nothing to do */
			break;
		case '=':
			/* defines separators */
			if (len < 5 || beg[len - 1] != '=')
				return MUSTACH_ERROR_BAD_SEPARATORS;
			beg++;
			len -= 2;
			for (l = 0; l < len && !isspace(beg[l]) ; l++);
			if (l == len)
				return MUSTACH_ERROR_BAD_SEPARATORS;
			oplen = l;
			tmp = alloca(oplen + 1);
			memcpy(tmp, beg, oplen);
			tmp[oplen] = 0;
			opstr = tmp;
			while (l < len && isspace(beg[l])) l++;
			if (l == len)
				return MUSTACH_ERROR_BAD_SEPARATORS;
			cllen = len - l;
			tmp = alloca(cllen + 1);
			memcpy(tmp, beg + l, cllen);
			tmp[cllen] = 0;
			clstr = tmp;
			break;
		case '^':
		case '#':
			/* begin section */
			if (depth == DEPTH_MAX)
				return MUSTACH_ERROR_TOO_DEEP;
			rc = emit;
			if (rc) {
				rc = itf->enter(closure, name);
				if (rc < 0)
					return rc;
			}

			if (template[0] == '\n')
				++template;

			stack[depth].name = beg;
			stack[depth].again = template;
			stack[depth].length = len;
			stack[depth].emit = emit;
			stack[depth].entered = rc;
			if ((c == '#') == (rc == 0))
				emit = 0;
			depth++;
			break;
		case '/':
			/* end section */
			if (depth-- == 0 || len != stack[depth].length || memcmp(stack[depth].name, name, len))
				return MUSTACH_ERROR_CLOSING;
			rc = emit && stack[depth].entered ? itf->next(closure) : 0;
			if (rc < 0)
				return rc;
			if (rc) {
				template = stack[depth++].again;
			} else {
				emit = stack[depth].emit;
				if (emit && stack[depth].entered)
					itf->leave(closure);
			}
			break;
		case '>':
			/* partials */
			if (emit) {
				rc = getpartial(itf, closure, name, &partial);
				if (rc == 0) {
					rc = process(partial, itf, closure, file, opstr, clstr);
					free(partial);
				}
				if (rc < 0)
					return rc;
			}
			break;
		default:
			/* replacement */
			if (emit) {
				rc = itf->put(closure, name, c != '&', file);
				if (rc < 0)
					return rc;
			}
			break;
		}
	}
}